

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

ssh2_userkey * ppk_load_f(Filename *filename,char *passphrase,char **errorstr)

{
  LoadedFile *lf;
  ssh2_userkey *psVar1;
  
  lf = lf_load_keyfile(filename,errorstr);
  if (lf == (LoadedFile *)0x0) {
    *errorstr = "can\'t open file";
    psVar1 = (ssh2_userkey *)0x0;
  }
  else {
    psVar1 = ppk_load_s(lf->binarysource_,passphrase,errorstr);
    lf_free(lf);
  }
  return psVar1;
}

Assistant:

ssh2_userkey *ppk_load_f(const Filename *filename, const char *passphrase,
                         const char **errorstr)
{
    LoadedFile *lf = lf_load_keyfile(filename, errorstr);
    ssh2_userkey *toret;
    if (lf) {
        toret = ppk_load_s(BinarySource_UPCAST(lf), passphrase, errorstr);
        lf_free(lf);
    } else {
        toret = NULL;
        *errorstr = "can't open file";
    }
    return toret;
}